

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parsePrimaryExpression(Parser *this)

{
  TokenType TVar1;
  Parser *in_RSI;
  allocator local_39;
  string local_38;
  Parser *this_local;
  
  this_local = this;
  TVar1 = Token::type(&in_RSI->mCurrentToken);
  if (TVar1 == NUMBER) {
    parseNumberExpression(this);
  }
  else if (TVar1 == IDENTIFIER) {
    parseIdentifierExpression(this);
  }
  else if (TVar1 == LEFT_PARENTHESIS) {
    parseParenthesisExpression(this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"Expected an expression",&local_39);
    parseError(in_RSI,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::unique_ptr<Expression,std::default_delete<Expression>>::
    unique_ptr<std::default_delete<Expression>,void>
              ((unique_ptr<Expression,std::default_delete<Expression>> *)this,(nullptr_t)0x0);
  }
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parsePrimaryExpression() {
	switch (mCurrentToken.type()) {
	case TokenType::NUMBER:
		return parseNumberExpression();
	case TokenType::IDENTIFIER:
		return parseIdentifierExpression();
	case TokenType::LEFT_PARENTHESIS:
		return parseParenthesisExpression();
	default:
		parseError("Expected an expression");
		return nullptr;
	}
}